

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# btStaticPlaneShape.cpp
# Opt level: O2

void __thiscall
btStaticPlaneShape::processAllTriangles
          (btStaticPlaneShape *this,btTriangleCallback *callback,btVector3 *aabbMin,
          btVector3 *aabbMax)

{
  btScalar bVar1;
  float fVar2;
  float fVar3;
  float fVar4;
  float fVar5;
  float fVar6;
  float fVar7;
  float fVar8;
  float fVar9;
  float fVar10;
  float fVar11;
  float fVar12;
  btVector3 bVar13;
  float local_c8;
  float fStack_c4;
  btVector3 tangentDir1;
  btVector3 tangentDir0;
  btVector3 halfExtents;
  undefined1 local_58 [16];
  undefined1 local_48 [16];
  undefined1 local_38 [16];
  
  bVar13 = operator-(aabbMax,aabbMin);
  halfExtents.m_floats[1] = bVar13.m_floats[1] * 0.5;
  halfExtents.m_floats[0] = bVar13.m_floats[0] * 0.5;
  halfExtents.m_floats[2] = bVar13.m_floats[2] * 0.5;
  halfExtents.m_floats[3] = 0.0;
  bVar1 = btVector3::length(&halfExtents);
  bVar13 = operator+(aabbMax,aabbMin);
  fVar4 = bVar13.m_floats[2] * 0.5;
  btPlaneSpace1<btVector3>(&this->m_planeNormal,&tangentDir0,&tangentDir1);
  local_c8 = bVar13.m_floats[0];
  fStack_c4 = bVar13.m_floats[1];
  local_58._0_4_ =
       ((this->m_planeNormal).m_floats[2] * fVar4 +
       (this->m_planeNormal).m_floats[0] * local_c8 * 0.5 +
       fStack_c4 * 0.5 * (this->m_planeNormal).m_floats[1]) - this->m_planeConstant;
  bVar13 = operator*(&this->m_planeNormal,(btScalar *)local_58);
  fVar4 = fVar4 - bVar13.m_floats[2];
  fVar7 = local_c8 * 0.5 - bVar13.m_floats[0];
  fVar9 = fStack_c4 * 0.5 - bVar13.m_floats[1];
  fVar2 = tangentDir0.m_floats[0] * bVar1;
  fVar3 = tangentDir0.m_floats[1] * bVar1;
  fVar5 = fVar7 + fVar2;
  fVar6 = fVar9 + fVar3;
  fVar8 = fVar4 + tangentDir0.m_floats[2] * bVar1;
  fVar10 = tangentDir1.m_floats[0] * bVar1;
  fVar11 = tangentDir1.m_floats[1] * bVar1;
  fVar12 = tangentDir1.m_floats[2] * bVar1;
  local_58._4_4_ = fVar6 + fVar11;
  local_58._0_4_ = fVar5 + fVar10;
  local_58._8_4_ = fVar8 + fVar12;
  local_58._12_4_ = 0;
  local_48._4_4_ = fVar6 - fVar11;
  local_48._0_4_ = fVar5 - fVar10;
  local_48._8_4_ = fVar8 - fVar12;
  local_48._12_4_ = 0;
  local_38._4_4_ = (fVar9 - fVar3) - fVar11;
  local_38._0_4_ = (fVar7 - fVar2) - fVar10;
  local_38._8_4_ = (fVar4 - tangentDir0.m_floats[2] * bVar1) - fVar12;
  local_38._12_4_ = 0;
  (*callback->_vptr_btTriangleCallback[2])(callback,local_58,0,0);
  fVar5 = fVar4 - tangentDir0.m_floats[2] * bVar1;
  fVar12 = bVar1 * tangentDir1.m_floats[2];
  fVar2 = tangentDir0.m_floats[0] * bVar1;
  fVar3 = tangentDir0.m_floats[1] * bVar1;
  fVar6 = fVar7 - fVar2;
  fVar8 = fVar9 - fVar3;
  fVar10 = tangentDir1.m_floats[0] * bVar1;
  fVar11 = tangentDir1.m_floats[1] * bVar1;
  local_58._4_4_ = fVar8 - fVar11;
  local_58._0_4_ = fVar6 - fVar10;
  local_58._8_4_ = fVar5 - fVar12;
  local_58._12_4_ = 0;
  local_48._4_4_ = fVar8 + fVar11;
  local_48._0_4_ = fVar6 + fVar10;
  local_48._8_4_ = fVar5 + fVar12;
  local_48._12_4_ = 0;
  local_38._4_4_ = fVar3 + fVar9 + fVar11;
  local_38._0_4_ = fVar2 + fVar7 + fVar10;
  local_38._8_4_ = tangentDir0.m_floats[2] * bVar1 + fVar4 + fVar12;
  local_38._12_4_ = 0;
  (*callback->_vptr_btTriangleCallback[2])(callback,local_58,0,1);
  return;
}

Assistant:

void	btStaticPlaneShape::processAllTriangles(btTriangleCallback* callback,const btVector3& aabbMin,const btVector3& aabbMax) const
{

	btVector3 halfExtents = (aabbMax - aabbMin) * btScalar(0.5);
	btScalar radius = halfExtents.length();
	btVector3 center = (aabbMax + aabbMin) * btScalar(0.5);
	
	//this is where the triangles are generated, given AABB and plane equation (normal/constant)

	btVector3 tangentDir0,tangentDir1;

	//tangentDir0/tangentDir1 can be precalculated
	btPlaneSpace1(m_planeNormal,tangentDir0,tangentDir1);

	btVector3 supVertex0,supVertex1;

	btVector3 projectedCenter = center - (m_planeNormal.dot(center) - m_planeConstant)*m_planeNormal;
	
	btVector3 triangle[3];
	triangle[0] = projectedCenter + tangentDir0*radius + tangentDir1*radius;
	triangle[1] = projectedCenter + tangentDir0*radius - tangentDir1*radius;
	triangle[2] = projectedCenter - tangentDir0*radius - tangentDir1*radius;

	callback->processTriangle(triangle,0,0);

	triangle[0] = projectedCenter - tangentDir0*radius - tangentDir1*radius;
	triangle[1] = projectedCenter - tangentDir0*radius + tangentDir1*radius;
	triangle[2] = projectedCenter + tangentDir0*radius + tangentDir1*radius;

	callback->processTriangle(triangle,0,1);

}